

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O1

void __thiscall chrono::ChLoadBase::Update(ChLoadBase *this,double time)

{
  bool bVar1;
  int iVar2;
  ChStateDelta mstate_w;
  ChState mstate_x;
  ChStateDelta local_c8;
  ChState local_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  iVar2 = (*(this->super_ChObj)._vptr_ChObj[6])();
  ChState::ChState(&local_b0,(long)iVar2,(ChIntegrable *)0x0);
  (*(this->super_ChObj)._vptr_ChObj[8])(this,&local_b0);
  iVar2 = (*(this->super_ChObj)._vptr_ChObj[7])(this);
  ChStateDelta::ChStateDelta(&local_c8,(long)iVar2,(ChIntegrable *)0x0);
  (*(this->super_ChObj)._vptr_ChObj[9])(this,&local_c8);
  (*(this->super_ChObj)._vptr_ChObj[0xc])(this,&local_b0,&local_c8);
  iVar2 = (*(this->super_ChObj)._vptr_ChObj[0x10])(this);
  if ((char)iVar2 == '\0') {
LAB_005d4083:
    if (local_c8.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_c8.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [-1]);
    }
    if (local_b0.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_b0.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [-1]);
    }
    return;
  }
  if (this->jacobians == (ChLoadJacobians *)0x0) {
    (*(this->super_ChObj)._vptr_ChObj[0xe])(this);
  }
  local_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  bVar1 = Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
          construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                      *)&local_38,&this->jacobians->K);
  if (bVar1) {
    local_68 = 0;
    uStack_60 = 0;
    uStack_58 = 0;
    uStack_50 = 0;
    bVar1 = Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>
            ::construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                      ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                        *)&local_68,&this->jacobians->R);
    if (bVar1) {
      local_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      uStack_80 = 0;
      bVar1 = Eigen::
              RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
              construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                        ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                          *)&local_98,&this->jacobians->M);
      if (bVar1) {
        (*(this->super_ChObj)._vptr_ChObj[0xd])
                  (this,&local_b0,&local_c8,&local_38,&local_68,&local_98);
        goto LAB_005d4083;
      }
    }
  }
  __assert_fail("success","/usr/include/eigen3/Eigen/src/Core/Ref.h",0x130,
                "Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>::Ref(PlainObjectBase<Derived> &, typename internal::enable_if<bool(Traits::template match<Derived>::MatchAtCompileTime), Derived>::type *) [PlainObjectType = Eigen::Matrix<double, -1, -1, 1>, Options = 0, StrideType = Eigen::OuterStride<>, Derived = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

void ChLoadBase::Update(double time) {
    // current state speed & position
    ChState mstate_x(LoadGet_ndof_x(), 0);
    LoadGetStateBlock_x(mstate_x);
    ChStateDelta mstate_w(LoadGet_ndof_w(), 0);
    LoadGetStateBlock_w(mstate_w);
    // compute the applied load, at current state
    ComputeQ(&mstate_x, &mstate_w);
    // compute the jacobian, at current state
    if (IsStiff()) {
        if (!jacobians)
            CreateJacobianMatrices();
        ComputeJacobian(&mstate_x, &mstate_w, jacobians->K, jacobians->R, jacobians->M);
    }
}